

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

void CVmObjList::join(vm_val_t *retval,vm_val_t *self_val,char *sep,size_t sep_len)

{
  int iVar1;
  vm_obj_id_t obj;
  char *pcVar2;
  CVmObject *this;
  size_t in_RCX;
  void *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  size_t es_len;
  char *es_1;
  vm_val_t tmp_str;
  char buf [128];
  char *dst;
  CVmObjString *strp;
  char *es;
  int lst_len;
  int i;
  size_t alo_len;
  vm_val_t ele;
  vm_val_t *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  vm_val_t *in_stack_fffffffffffffef8;
  vm_val_t *this_00;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int iVar3;
  vm_val_t *in_stack_ffffffffffffff08;
  vm_val_t *in_stack_ffffffffffffff10;
  CVmObjString *in_stack_ffffffffffffff18;
  char local_d8 [8];
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff30;
  vm_val_t *in_stack_ffffffffffffff38;
  int local_3c;
  int local_30;
  int local_28;
  
  CVmStack::push(in_RSI);
  iVar1 = vm_val_t::ll_length(in_stack_fffffffffffffef8);
  for (local_3c = 1; local_3c <= iVar1; local_3c = local_3c + 1) {
    vm_val_t::ll_index(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
                      );
    pcVar2 = vm_val_t::get_as_string(in_stack_fffffffffffffee8);
    iVar3 = local_30;
    if (pcVar2 != (char *)0x0) {
      vmb_get_len((char *)0x370e5c);
      iVar3 = in_stack_ffffffffffffff04;
    }
    in_stack_ffffffffffffff04 = iVar3;
  }
  this_00 = in_RDI;
  obj = CVmObjString::create(in_stack_fffffffffffffef4,(size_t)in_stack_fffffffffffffee8);
  vm_val_t::set_obj(this_00,obj);
  this = vm_objp(0);
  CVmObjString::cons_get_buf((CVmObjString *)this);
  CVmStack::push(in_RDI);
  local_3c = 1;
  do {
    if (iVar1 < local_3c) {
      CVmObjString::cons_shrink_buffer
                ((CVmObjString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (char *)this_00);
      CVmStack::discard(2);
      return;
    }
    vm_val_t::ll_index(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
                      );
    vm_val_t::set_nil((vm_val_t *)&stack0xffffffffffffff18);
    pcVar2 = vm_val_t::get_as_string(in_stack_fffffffffffffee8);
    if (pcVar2 == (char *)0x0) {
      if (local_30 == 1) {
        in_stack_ffffffffffffff10 = (vm_val_t *)0x3a9505;
        in_stack_ffffffffffffff08 = (vm_val_t *)0x0;
      }
      else if (local_30 == 7) {
        sprintf(local_d8,"%ld",(long)local_28);
        in_stack_ffffffffffffff10 = (vm_val_t *)local_d8;
        in_stack_ffffffffffffff08 = (vm_val_t *)strlen((char *)in_stack_ffffffffffffff10);
      }
      else {
        pcVar2 = vm_val_t::cast_to_string
                           (in_stack_ffffffffffffff38,
                            (vm_val_t *)in_stack_ffffffffffffff30.native_desc);
        if (pcVar2 == (char *)0x0) {
          err_throw(0);
        }
        in_stack_ffffffffffffff08 = (vm_val_t *)vmb_get_len((char *)0x371086);
        in_stack_ffffffffffffff10 = (vm_val_t *)(pcVar2 + 2);
      }
    }
    else {
      in_stack_ffffffffffffff08 = (vm_val_t *)vmb_get_len((char *)0x370fd3);
      in_stack_ffffffffffffff10 = (vm_val_t *)(pcVar2 + 2);
    }
    CVmStack::push((vm_val_t *)&stack0xffffffffffffff18);
    pcVar2 = CVmObjString::cons_ensure_space
                       (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                        (size_t)in_stack_ffffffffffffff08,
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    memcpy(pcVar2,in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    if ((local_3c < iVar1) && (in_RCX != 0)) {
      pcVar2 = CVmObjString::cons_ensure_space
                         (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                          (size_t)in_stack_ffffffffffffff08,
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      memcpy(pcVar2,in_RDX,in_RCX);
    }
    CVmStack::discard(1);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void CVmObjList::join(VMG_ vm_val_t *retval,
                      const vm_val_t *self_val,
                      const char *sep, size_t sep_len)
{
    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Do a first pass through the list to measure the size we'll need.
     *   For string elements we'll know exactly what we need; for
     *   non-strings, make a guess, and we'll expand the buffer later if
     *   needed.  
     */
    vm_val_t ele;
    size_t alo_len = 0;
    int i, lst_len = self_val->ll_length(vmg0_);
    for (i = 1 ; i <= lst_len ; ++i)
    {
        /* get this element */
        self_val->ll_index(vmg_ &ele, i);

        /* if it's a string, get its length; for other types, make a guess */
        const char *es = ele.get_as_string(vmg0_);
        if (es != 0)
        {
            /* it's a string - add its length to the running total */
            alo_len += vmb_get_len(es);
        }
        else
        {
            /* for other types, guess based on the type */
            switch (ele.typ)
            {
            case VM_INT:
                /* integers - leave room for 10 characters */
                alo_len += 10;
                break;

            case VM_OBJ:
                /* 
                 *   object conversion could take almost any amount of space;
                 *   make a wild guess for now 
                 */
                alo_len += 128;
                break;

            default:
                /* assume nothing for other types */
                break;
            }
        }
    }

    /* add in the space needed for the separators */
    if (lst_len > 0)
        alo_len += sep_len * (lst_len - 1);

    /* create a string with the allocated size */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, alo_len));
    CVmObjString *strp = (CVmObjString *)vm_objp(vmg_ retval->val.obj);

    /* get a write pointer to the buffer */
    char *dst = strp->cons_get_buf();

    /* push it for gc protection */
    G_stk->push(retval);

    /* build the string */
    for (i = 1 ; i <= lst_len ; ++i)
    {
        char buf[128];
        vm_val_t tmp_str;

        /* get this element */
        self_val->ll_index(vmg_ &ele, i);

        /* assume we won't need a temporary string */
        tmp_str.set_nil();

        /* try getting it as a string directly */
        const char *es = ele.get_as_string(vmg0_);
        size_t es_len;
        if (es != 0)
        {
            /* it's a string - get its length and buffer */
            es_len = vmb_get_len(es);
            es += VMB_LEN;
        }
        else
        {
            /* for other types, do the implied string conversion */
            switch (ele.typ)
            {
            case VM_INT:
                /* integer - format in decimal */
                sprintf(buf, "%ld", (long)ele.val.intval);
                es = buf;
                es_len = strlen(es);
                break;

            case VM_NIL:
                /* nil - use an empty string */
                es = "";
                es_len = 0;
                break;

            default:
                /* for anything else, see what casting comes up with */
                if ((es = ele.cast_to_string(vmg_ &tmp_str)) == 0)
                    err_throw(VMERR_BAD_TYPE_BIF);

                /* get the length and buffer */
                es_len = vmb_get_len(es);
                es += VMB_LEN;
                break;
            }
        }

        /* push the temp string (if any) for gc protection */
        G_stk->push(&tmp_str);

        /* append the current string, making sure we have enough space */
        dst = strp->cons_ensure_space(vmg_ dst, es_len, 256);
        memcpy(dst, es, es_len);
        dst += es_len;

        /* if there's another element, append the separator */
        if (i < lst_len && sep_len != 0)
        {
            dst = strp->cons_ensure_space(vmg_ dst, sep_len, 32);
            memcpy(dst, sep, sep_len);
            dst += sep_len;
        }

        /* discard the temp string */
        G_stk->discard(1);
    }

    /* set the string to its final length */
    strp->cons_shrink_buffer(vmg_ dst);

    /* remove gc protection */
    G_stk->discard(2);
}